

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O3

void slang::bitcpy(uint64_t *dest,uint32_t destOffset,uint64_t *src,uint32_t length,
                  uint32_t srcOffset)

{
  sbyte sVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong uVar10;
  
  if (length != 0) {
    puVar8 = dest + (destOffset >> 6);
    uVar7 = srcOffset & 0x3f;
    puVar9 = src + (srcOffset >> 6);
    uVar4 = destOffset & 0x3f;
    if (uVar4 != 0) {
      uVar2 = 0x40 - uVar4;
      if (length <= 0x40 - uVar4) {
        uVar2 = length;
      }
      uVar10 = *puVar9;
      if (uVar7 != 0) {
        uVar10 = uVar10 >> (sbyte)uVar7;
        if (0x40 - uVar7 < uVar2) {
          uVar10 = uVar10 | puVar9[1] << ((byte)(0x40 - uVar7) & 0x3f);
        }
      }
      uVar5 = ~(-1L << ((byte)uVar2 & 0x3f));
      length = length - uVar2;
      *puVar8 = (uVar10 & uVar5) << (sbyte)uVar4 | ~(uVar5 << (sbyte)uVar4) & *puVar8;
      puVar8 = puVar8 + 1;
      puVar9 = puVar9 + (uVar7 + uVar2 >> 6);
      uVar7 = uVar7 + uVar2 & 0x3f;
    }
    sVar1 = (sbyte)uVar7;
    if (0x3f < length) {
      lVar6 = 0;
      lVar3 = 0;
      do {
        uVar10 = puVar9[lVar3];
        if (uVar7 != 0) {
          uVar10 = uVar10 >> sVar1 | puVar9[lVar3 + 1] << (0x40U - sVar1 & 0x3f);
        }
        puVar8[lVar3] = uVar10;
        lVar3 = lVar3 + 1;
        lVar6 = lVar6 + -8;
      } while (length >> 6 != (uint)lVar3);
      puVar8 = (ulong *)((long)puVar8 - lVar6);
      puVar9 = (ulong *)((long)puVar9 - lVar6);
    }
    uVar4 = length & 0x3f;
    if (uVar4 != 0) {
      uVar5 = -1L << (sbyte)uVar4;
      uVar10 = *puVar9;
      if (uVar7 != 0) {
        uVar10 = uVar10 >> sVar1;
        if (0x40 - uVar7 < uVar4) {
          uVar10 = uVar10 | puVar9[1] << ((byte)(0x40 - uVar7) & 0x3f);
        }
      }
      *puVar8 = uVar5 & *puVar8 | uVar10 & ~uVar5;
    }
  }
  return;
}

Assistant:

static void bitcpy(uint64_t* dest, uint32_t destOffset, const uint64_t* src, uint32_t length,
                   uint32_t srcOffset = 0) {
    if (length == 0)
        return;

    // Get the first word we want to write to, and the remaining bits are an offset.
    const uint32_t BitsPerWord = SVInt::BITS_PER_WORD;
    dest += destOffset / BitsPerWord;
    destOffset %= BitsPerWord;
    src += srcOffset / BitsPerWord;
    srcOffset %= BitsPerWord;

    // Writing to the first word is a special case, due to the bit offset
    if (destOffset) {
        uint32_t bitsToWrite = std::min(length, BitsPerWord - destOffset);
        length -= bitsToWrite;

        uint64_t srcWord;
        if (srcOffset) {
            // Be careful not to read past the bounds of the array.
            srcWord = *src >> srcOffset;
            if (BitsPerWord - srcOffset < bitsToWrite)
                srcWord |= src[1] << (BitsPerWord - srcOffset);
        }
        else {
            srcWord = *src;
        }

        uint64_t mask = (1ull << bitsToWrite) - 1;
        *dest = (*dest & ~(mask << destOffset)) | ((srcWord & mask) << destOffset);

        dest++;
        srcOffset += bitsToWrite;
        src += srcOffset / BitsPerWord;
        srcOffset %= BitsPerWord;
    }

    // Do a bulk copy of whole words, with all writes to dest word-aligned.
    for (uint32_t i = 0; i < length / BitsPerWord; i++) {
        *dest = srcOffset ? (*src >> srcOffset) | (src[1] << (BitsPerWord - srcOffset)) : *src;
        dest++;
        src++;
    }

    // Handle leftover bits in the final word.
    if (length %= BitsPerWord) {
        uint64_t mask = (1ull << length) - 1;
        uint64_t srcWord;
        if (srcOffset) {
            // Be careful not to read past the bounds of the array.
            srcWord = *src >> srcOffset;
            if (BitsPerWord - srcOffset < length)
                srcWord |= src[1] << (BitsPerWord - srcOffset);
        }
        else {
            srcWord = *src;
        }

        *dest = (*dest & ~mask) | (srcWord & mask);
    }
}